

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcolk.c
# Opt level: O0

int ffintfi2(int *input,long ntodo,double scale,double zero,short *output,int *status)

{
  double dVar1;
  double dvalue;
  long ii;
  int *status_local;
  short *output_local;
  double zero_local;
  double scale_local;
  long ntodo_local;
  int *input_local;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 0.0)) || (NAN(zero))) {
    for (dvalue = 0.0; (long)dvalue < ntodo; dvalue = (double)((long)dvalue + 1)) {
      dVar1 = ((double)input[(long)dvalue] - zero) / scale;
      if (-32768.49 <= dVar1) {
        if (dVar1 <= 32767.49) {
          if (dVar1 < 0.0) {
            output[(long)dvalue] = (short)(int)(dVar1 + -0.5);
          }
          else {
            output[(long)dvalue] = (short)(int)(dVar1 + 0.5);
          }
        }
        else {
          *status = -0xb;
          output[(long)dvalue] = 0x7fff;
        }
      }
      else {
        *status = -0xb;
        output[(long)dvalue] = -0x8000;
      }
    }
  }
  else {
    for (dvalue = 0.0; (long)dvalue < ntodo; dvalue = (double)((long)dvalue + 1)) {
      if (input[(long)dvalue] < -0x8000) {
        *status = -0xb;
        output[(long)dvalue] = -0x8000;
      }
      else if (input[(long)dvalue] < 0x8000) {
        output[(long)dvalue] = (short)input[(long)dvalue];
      }
      else {
        *status = -0xb;
        output[(long)dvalue] = 0x7fff;
      }
    }
  }
  return *status;
}

Assistant:

int ffintfi2(int *input,       /* I - array of values to be converted  */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            short *output,     /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required.
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
        {
            if (input[ii] < SHRT_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = SHRT_MIN;
            }
            else if (input[ii] > SHRT_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = SHRT_MAX;
            }
            else
                output[ii] = input[ii];
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DSHRT_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = SHRT_MIN;
            }
            else if (dvalue > DSHRT_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = SHRT_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    output[ii] = (short) (dvalue + .5);
                else
                    output[ii] = (short) (dvalue - .5);
            }
        }
    }
    return(*status);
}